

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_embedded_expr(CTcEmbedBuilder *b,CTcEmbedTokenList *tl)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsNode *func;
  CTcPrsNode *pCVar3;
  undefined4 extraout_var_00;
  CTPNArglist *arglist;
  CTPNArg *pCVar4;
  CTPNCall *this;
  CTcStrTemplate *tpl;
  
  tpl = G_prs->str_template_head_;
  while( true ) {
    if (tpl == (CTcStrTemplate *)0x0) {
      CTcEmbedTokenList::unget(tl,0,0);
      iVar2 = (*b->_vptr_CTcEmbedBuilder[3])(b);
      return (CTcPrsNode *)CONCAT44(extraout_var,iVar2);
    }
    iVar2 = CTcEmbedTokenList::match(tl,tpl);
    if (iVar2 != 0) break;
    tpl = tpl->nxt;
  }
  func = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
  func[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)tpl->func;
  (func->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00317c80;
  if (tpl->star == 0) {
    arglist = (CTPNArglist *)CTcPrsMem::alloc(G_prsmem,0x18);
    iVar2 = 0;
    pCVar4 = (CTPNArg *)0x0;
  }
  else {
    if (tpl->cnt < 2) {
      CTcEmbedTokenList::unget(tl,0,0);
      iVar2 = (*b->_vptr_CTcEmbedBuilder[3])(b);
      pCVar3 = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      CTcEmbedTokenList::reduce(tl,tpl);
      pCVar3 = parse_embedded_expr(b,tl);
    }
    if (pCVar3 == (CTcPrsNode *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    arglist = (CTPNArglist *)CTcPrsMem::alloc(G_prsmem,0x18);
    pCVar4 = (CTPNArg *)CTcPrsMem::alloc(G_prsmem,0x48);
    (pCVar4->super_CTPNArgBase).arg_expr_ = pCVar3;
    (pCVar4->super_CTPNArgBase).next_arg_ = (CTPNArg *)0x0;
    puVar1 = &(pCVar4->super_CTPNArgBase).field_0x40;
    *puVar1 = *puVar1 & 0xfe;
    (pCVar4->super_CTPNArgBase).name_.typ_ = TOKT_INVALID;
    (pCVar4->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00318158;
    iVar2 = 1;
  }
  (arglist->super_CTPNArglistBase).argc_ = iVar2;
  (arglist->super_CTPNArglistBase).list_ = pCVar4;
  (arglist->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_003119f0;
  this = (CTPNCall *)CTcPrsMem::alloc(G_prsmem,0x18);
  CTPNCall::CTPNCall(this,func,arglist);
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_expr(
    CTcEmbedBuilder *b, CTcEmbedTokenList *tl)
{
    /* search for a template for the expression */
    for (CTcStrTemplate *st = G_prs->get_str_template_head() ; st != 0 ;
         st = st->nxt)
    {
        /* check for a match */
        if (tl->match(st))
        {
            /*
             *   This template matches.  Generate the code as a call to the
             *   template's processor function.
             */
            CTPNSymResolved *func = new CTPNSymResolved(st->func);

            /* 
             *   If the template has a '*', the tokens matching the star are
             *   a sub-expression that we evaluate as the argument to the
             *   function.  Otherwise we call it with no arguments. 
             */
            CTPNArglist *arglist;
            if (st->star)
            {
                /* 
                 *   If the template has any fixed tokens, reparse the
                 *   remaining tokens to see if they refer to a new template.
                 *   If the template was just '*', skip this, since we'd just
                 *   find the same match again.  
                 */
                CTcPrsNode *sub;
                if (st->cnt > 1)
                {
                    /* remove the tokens that matched the fixed part */
                    tl->reduce(st);

                    /* reparse as a new embedded expression */
                    sub = parse_embedded_expr(b, tl);
                }
                else
                {
                    /* the template is just '*', so parse a raw expression */
                    tl->unget();
                    sub = b->parse_expr();
                }

                /* if we failed to parse a sub-expression, return failure */
                if (sub == 0)
                    return 0;
                
                /* create the argument list */
                arglist = new CTPNArglist(1, new CTPNArg(sub));
            }
            else
            {
                /* there's no argument list */
                arglist = new CTPNArglist(0, 0);
            }

            /* create and return the call to the template function */
            return new CTPNCall(func, arglist);
        }
    }

    /* 
     *   There's no template, so process it as an ordinary expression.  Put
     *   the captured token list back into the token stream, and parse an
     *   expression node.  
     */
    tl->unget();
    return b->parse_expr();
}